

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

bool lsim::serialize_library(LSimContext *context,ModelCircuitLibrary *lib,char *filename)

{
  pointer pbVar1;
  undefined8 uVar2;
  char cVar3;
  char cVar4;
  ModelCircuitLibrary *pMVar5;
  ModelComponent *pMVar6;
  const_iterator cVar7;
  char_t *rhs;
  ModelWire *this;
  Point *pPVar8;
  ulong uVar9;
  ModelCircuit *pMVar10;
  uint uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ref;
  pointer pbVar12;
  _Hash_node_base *p_Var13;
  size_t sVar14;
  ulong uVar15;
  xml_node_struct *pxVar16;
  uint uVar17;
  xml_node_struct *pxVar18;
  xml_node ref_node;
  xml_node wire_node;
  xml_node orient_node;
  xml_node comp_node;
  xml_node circuit_node;
  vector<unsigned_int,_std::allocator<unsigned_int>_> comp_ids;
  xml_node pin_node;
  Serializer serializer;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [40];
  xml_node_struct *local_190;
  xml_node_struct *local_188;
  xml_attribute local_180;
  uint local_178;
  undefined1 local_170 [40];
  xml_node_struct *local_148;
  xml_node_struct *local_140;
  xml_attribute_struct *local_138;
  size_t local_130;
  xml_node_struct *local_128;
  xml_attribute local_120;
  xml_node local_118;
  LSimContext *local_110;
  xml_document local_108;
  xml_node local_38;
  
  if (context == (LSimContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x232,
                  "bool lsim::serialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  if (lib == (ModelCircuitLibrary *)0x0) {
    __assert_fail("lib",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x233,
                  "bool lsim::serialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  local_138 = (xml_attribute_struct *)filename;
  if (filename == (char *)0x0) {
    __assert_fail("filename",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x234,
                  "bool lsim::serialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  local_110 = context;
  pugi::xml_document::xml_document(&local_108);
  pugi::xml_node::xml_node(&local_38);
  local_38 = pugi::xml_node::append_child(&local_108.super_xml_node,"lsim");
  local_1c8._0_8_ = pugi::xml_node::append_attribute(&local_38,"version");
  pugi::xml_attribute::set_value((xml_attribute *)local_1c8,"2");
  pbVar12 = (lib->m_references).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (lib->m_references).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_170._24_8_ = lib;
  if (pbVar12 != pbVar1) {
    do {
      pMVar5 = LSimContext::library_by_name(local_110,(pbVar12->_M_dataplus)._M_p);
      if (pMVar5 != (ModelCircuitLibrary *)0x0) {
        local_1c8._0_8_ = pugi::xml_node::append_child(&local_38,"reference");
        local_180 = pugi::xml_node::append_attribute((xml_node *)local_1c8,"name");
        pugi::xml_attribute::set_value(&local_180,(pbVar12->_M_dataplus)._M_p);
        local_180 = pugi::xml_node::append_attribute((xml_node *)local_1c8,"file");
        pugi::xml_attribute::set_value(&local_180,(pMVar5->m_path)._M_dataplus._M_p);
      }
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar1);
  }
  if ((((circuit_container_t *)(local_170._24_8_ + 0x40))->
      super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (((circuit_container_t *)(local_170._24_8_ + 0x40))->
      super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    sVar14 = 0;
    do {
      local_130 = sVar14;
      local_1b8._24_8_ =
           ModelCircuitLibrary::circuit_by_idx((ModelCircuitLibrary *)local_170._24_8_,sVar14);
      local_170._16_8_ = pugi::xml_node::append_child(&local_38,"circuit");
      local_1c8._0_8_ = pugi::xml_node::append_attribute((xml_node *)(local_170 + 0x10),"name");
      pugi::xml_attribute::set_value
                ((xml_attribute *)local_1c8,
                 (((string *)(local_1b8._24_8_ + 0x10))->_M_dataplus)._M_p);
      ModelCircuit::component_ids
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_170 + 0x20),
                 (ModelCircuit *)local_1b8._24_8_);
      pxVar16 = local_148;
      for (pxVar18 = (xml_node_struct *)local_170._32_8_; pxVar18 != pxVar16;
          pxVar18 = (xml_node_struct *)((long)&pxVar18->header + 4)) {
        pMVar6 = ModelCircuit::component_by_id
                           ((ModelCircuit *)local_1b8._24_8_,(uint32_t)pxVar18->header);
        local_180._attr =
             (xml_attribute_struct *)
             pugi::xml_node::append_child((xml_node *)(local_170 + 0x10),"component");
        local_1c8._0_8_ = pugi::xml_node::append_attribute((xml_node *)&local_180,"id");
        pugi::xml_attribute::set_value((xml_attribute *)local_1c8,pMVar6->m_id);
        local_1c8._0_4_ = pMVar6->m_type;
        cVar7 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)(anonymous_namespace)::component_type_to_name_abi_cxx11_,
                       (key_type *)local_1c8);
        if (cVar7.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          local_1c8._0_8_ = pugi::xml_node::append_attribute((xml_node *)&local_180,"type");
          pugi::xml_attribute::set_value((xml_attribute *)local_1c8,pMVar6->m_type);
        }
        else {
          local_1c8._0_8_ = pugi::xml_node::append_attribute((xml_node *)&local_180,"type");
          pugi::xml_attribute::set_value
                    ((xml_attribute *)local_1c8,
                     *(char_t **)
                      ((long)cVar7.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                             ._M_cur + 0x10));
        }
        local_1c8._0_8_ = pugi::xml_node::append_attribute((xml_node *)&local_180,"inputs");
        pugi::xml_attribute::set_value((xml_attribute *)local_1c8,pMVar6->m_inputs);
        local_1c8._0_8_ = pugi::xml_node::append_attribute((xml_node *)&local_180,"outputs");
        pugi::xml_attribute::set_value((xml_attribute *)local_1c8,pMVar6->m_outputs);
        local_1c8._0_8_ = pugi::xml_node::append_attribute((xml_node *)&local_180,"controls");
        pugi::xml_attribute::set_value((xml_attribute *)local_1c8,pMVar6->m_controls);
        if (pMVar6->m_nested_circuit != (ModelCircuit *)0x0) {
          local_1b8._32_8_ = pugi::xml_node::append_attribute((xml_node *)&local_180,"nested");
          ModelCircuit::qualified_name_abi_cxx11_((string *)local_1c8,pMVar6->m_nested_circuit);
          pugi::xml_attribute::set_value
                    ((xml_attribute *)(local_1b8 + 0x20),(char_t *)local_1c8._0_8_);
          if ((xml_attribute_struct *)local_1c8._0_8_ != (xml_attribute_struct *)local_1b8) {
            operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
          }
        }
        for (p_Var13 = (pMVar6->m_properties)._M_h._M_before_begin._M_nxt;
            p_Var13 != (_Hash_node_base *)0x0; p_Var13 = p_Var13->_M_nxt) {
          local_1b8._32_8_ = pugi::xml_node::append_child((xml_node *)&local_180,"property");
          local_1c8._0_8_ = pugi::xml_node::append_attribute((xml_node *)(local_1b8 + 0x20),"key");
          rhs = (char_t *)(*(code *)(p_Var13[5]._M_nxt)->_M_nxt[2]._M_nxt)();
          pugi::xml_attribute::set_value((xml_attribute *)local_1c8,rhs);
          local_1b8._16_8_ =
               pugi::xml_node::append_attribute((xml_node *)(local_1b8 + 0x20),"value");
          (*(code *)(p_Var13[5]._M_nxt)->_M_nxt[4]._M_nxt)(local_1c8);
          pugi::xml_attribute::set_value
                    ((xml_attribute *)(local_1b8 + 0x10),(char_t *)local_1c8._0_8_);
          if ((xml_attribute_struct *)local_1c8._0_8_ != (xml_attribute_struct *)local_1b8) {
            operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
          }
        }
        local_1c8._0_8_ = pugi::xml_node::append_child((xml_node *)&local_180,"position");
        local_1b8._32_8_ = pugi::xml_node::append_attribute((xml_node *)local_1c8,"x");
        pugi::xml_attribute::set_value((xml_attribute *)(local_1b8 + 0x20),(pMVar6->m_position).x);
        local_1b8._32_8_ = pugi::xml_node::append_attribute((xml_node *)local_1c8,"y");
        pugi::xml_attribute::set_value((xml_attribute *)(local_1b8 + 0x20),(pMVar6->m_position).y);
        local_1b8._32_8_ = pugi::xml_node::append_child((xml_node *)&local_180,"orientation");
        local_1b8._16_8_ = pugi::xml_node::append_attribute((xml_node *)(local_1b8 + 0x20),"angle");
        pugi::xml_attribute::set_value((xml_attribute *)(local_1b8 + 0x10),pMVar6->m_angle);
      }
      ModelCircuit::wire_ids
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_1b8 + 0x20),
                 (ModelCircuit *)local_1b8._24_8_);
      local_128 = local_190;
      pxVar16 = (xml_node_struct *)local_1b8._32_8_;
      if ((xml_node_struct *)local_1b8._32_8_ != local_190) {
        do {
          this = ModelCircuit::wire_by_id
                           ((ModelCircuit *)local_1b8._24_8_,(uint32_t)pxVar16->header);
          local_1b8._16_8_ = pugi::xml_node::append_child((xml_node *)(local_170 + 0x10),"wire");
          local_1c8._0_8_ = pugi::xml_node::append_attribute((xml_node *)(local_1b8 + 0x10),"id");
          pugi::xml_attribute::set_value((xml_attribute *)local_1c8,this->m_id);
          if ((this->m_segments).
              super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (this->m_segments).
              super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            sVar14 = 0;
            do {
              local_1c8._0_8_ =
                   pugi::xml_node::append_child((xml_node *)(local_1b8 + 0x10),"segment");
              pPVar8 = ModelWire::segment_point(this,sVar14,0);
              local_180 = pugi::xml_node::append_attribute((xml_node *)local_1c8,"x1");
              pugi::xml_attribute::set_value(&local_180,pPVar8->x);
              local_180 = pugi::xml_node::append_attribute((xml_node *)local_1c8,"y1");
              pugi::xml_attribute::set_value(&local_180,pPVar8->y);
              pPVar8 = ModelWire::segment_point(this,sVar14,1);
              local_180 = pugi::xml_node::append_attribute((xml_node *)local_1c8,"x2");
              pugi::xml_attribute::set_value(&local_180,pPVar8->x);
              local_180 = pugi::xml_node::append_attribute((xml_node *)local_1c8,"y2");
              pugi::xml_attribute::set_value(&local_180,pPVar8->y);
              sVar14 = sVar14 + 1;
            } while (sVar14 < (ulong)((long)(this->m_segments).
                                            super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->m_segments).
                                            super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          if ((this->m_pins).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (this->m_pins).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            sVar14 = 0;
            do {
              local_118 = pugi::xml_node::append_child((xml_node *)(local_1b8 + 0x10),"pin");
              local_120 = pugi::xml_node::append_attribute(&local_118,"value");
              uVar9 = ModelWire::pin(this,sVar14);
              uVar15 = uVar9 >> 0x20;
              cVar4 = '\x01';
              uVar17 = (uint)(uVar9 >> 0x20);
              if (4 < uVar17 >> 1) {
                cVar3 = '\x04';
                do {
                  cVar4 = cVar3;
                  uVar11 = (uint)uVar15;
                  if (uVar11 < 100) {
                    cVar4 = cVar4 + -2;
                    goto LAB_00112018;
                  }
                  if (uVar11 < 1000) {
                    cVar4 = cVar4 + -1;
                    goto LAB_00112018;
                  }
                  if (uVar11 < 10000) goto LAB_00112018;
                  uVar15 = uVar15 / 10000;
                  cVar3 = cVar4 + '\x04';
                } while (99999 < uVar11);
                cVar4 = cVar4 + '\x01';
              }
LAB_00112018:
              local_180._attr = (xml_attribute_struct *)local_170;
              std::__cxx11::string::_M_construct((ulong)&local_180,cVar4);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)local_180._attr,local_178,uVar17);
              std::__cxx11::string::append((char *)&local_180);
              cVar4 = '\x01';
              uVar17 = (uint)uVar9;
              if (9 < uVar17) {
                cVar3 = '\x04';
                do {
                  cVar4 = cVar3;
                  uVar11 = (uint)uVar9;
                  if (uVar11 < 100) {
                    cVar4 = cVar4 + -2;
                    goto LAB_0011209d;
                  }
                  if (uVar11 < 1000) {
                    cVar4 = cVar4 + -1;
                    goto LAB_0011209d;
                  }
                  if (uVar11 < 10000) goto LAB_0011209d;
                  uVar9 = (uVar9 & 0xffffffff) / 10000;
                  cVar3 = cVar4 + '\x04';
                } while (99999 < uVar11);
                cVar4 = cVar4 + '\x01';
              }
LAB_0011209d:
              local_1c8._0_8_ = local_1b8;
              std::__cxx11::string::_M_construct((ulong)local_1c8,cVar4);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)local_1c8._0_8_,local_1c8._8_4_,uVar17);
              std::__cxx11::string::_M_append((char *)&local_180,local_1c8._0_8_);
              if ((xml_node_struct *)local_1c8._0_8_ != (xml_node_struct *)local_1b8) {
                operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
              }
              pugi::xml_attribute::set_value(&local_120,(char_t *)local_180._attr);
              if ((xml_node_struct *)local_180._attr != (xml_node_struct *)local_170) {
                operator_delete(local_180._attr,local_170._0_8_ + 1);
              }
              sVar14 = sVar14 + 1;
            } while (sVar14 < (ulong)((long)(this->m_pins).
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->m_pins).
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 4);
        } while (pxVar16 != local_128);
      }
      if ((xml_node_struct *)local_1b8._32_8_ != (xml_node_struct *)0x0) {
        operator_delete((void *)local_1b8._32_8_,(long)local_188 - local_1b8._32_8_);
      }
      if ((xml_node_struct *)local_170._32_8_ != (xml_node_struct *)0x0) {
        operator_delete((void *)local_170._32_8_,(long)local_140 - local_170._32_8_);
      }
      sVar14 = local_130 + 1;
    } while (sVar14 < (ulong)((long)(((circuit_container_t *)(local_170._24_8_ + 0x40))->
                                    super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(((circuit_container_t *)(local_170._24_8_ + 0x40))->
                                    super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  uVar2 = local_170._24_8_;
  pMVar10 = ModelCircuitLibrary::circuit_by_name
                      ((ModelCircuitLibrary *)local_170._24_8_,
                       (((string *)(local_170._24_8_ + 0x90))->_M_dataplus)._M_p);
  if (pMVar10 != (ModelCircuit *)0x0) {
    local_1c8._0_8_ = pugi::xml_node::append_child(&local_38,"main");
    local_180 = pugi::xml_node::append_attribute((xml_node *)local_1c8,"name");
    pugi::xml_attribute::set_value(&local_180,(((string *)(uVar2 + 0x90))->_M_dataplus)._M_p);
  }
  pugi::xml_document::save_file(&local_108,(char *)local_138,"\t",1,encoding_auto);
  pugi::xml_document::~xml_document(&local_108);
  return true;
}

Assistant:

bool serialize_library(LSimContext *context, ModelCircuitLibrary *lib, const char *filename) {
    assert(context);
    assert(lib);
    assert(filename);

    Serializer serializer(context);
    serializer.serialize_library(lib);
    serializer.dump_to_file(filename);

    return true;
}